

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O2

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitStmt
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,BlockStatement *stmt)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  StatementBlockSymbol *pSVar3;
  Statement *this_00;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  pointer piVar6;
  size_type sVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  long lVar12;
  value_type *elements;
  ulong pos0;
  EVP_PKEY_CTX *this_01;
  int iVar13;
  value_type *elements_1;
  ulong hash;
  ulong uVar14;
  Statement **ppSVar15;
  StatementSyntax *pSVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  BlockStatement *pBVar20;
  long lVar21;
  ulong uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  byte bVar26;
  uchar uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  iterator pos;
  try_emplace_args_t local_b1;
  BlockStatement *local_b0;
  StatementBlockSymbol *local_a8;
  long local_a0;
  uchar local_98;
  uchar uStack_97;
  uchar uStack_96;
  byte bStack_95;
  uchar uStack_94;
  uchar uStack_93;
  uchar uStack_92;
  byte bStack_91;
  uchar uStack_90;
  uchar uStack_8f;
  uchar uStack_8e;
  byte bStack_8d;
  uchar uStack_8c;
  uchar uStack_8b;
  uchar uStack_8a;
  byte bStack_89;
  Statement *stmtPtr;
  size_type local_80;
  group_type_pointer local_78;
  Statement local_70;
  locator local_48;
  
  pSVar3 = stmt->blockSymbol;
  local_b0 = stmt;
  if (pSVar3 != (StatementBlockSymbol *)0x0) {
    this_01 = (EVP_PKEY_CTX *)&this->disableBranches;
    stmtPtr = &local_70;
    local_80 = 0;
    local_78 = (group_type_pointer)0xa;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = pSVar3;
    hash = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> ((byte)(this->disableBranches).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
                          .arrays.groups_size_index & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    uVar19 = (this->disableBranches).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
             .arrays.groups_size_mask;
    uVar14 = 0;
    uVar22 = pos0;
    do {
      pgVar4 = (this->disableBranches).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
               .arrays.groups_ + uVar22;
      local_98 = pgVar4->m[0].n;
      uStack_97 = pgVar4->m[1].n;
      uStack_96 = pgVar4->m[2].n;
      bStack_95 = pgVar4->m[3].n;
      uStack_94 = pgVar4->m[4].n;
      uStack_93 = pgVar4->m[5].n;
      uStack_92 = pgVar4->m[6].n;
      bStack_91 = pgVar4->m[7].n;
      uStack_90 = pgVar4->m[8].n;
      uStack_8f = pgVar4->m[9].n;
      uStack_8e = pgVar4->m[10].n;
      bStack_8d = pgVar4->m[0xb].n;
      uStack_8c = pgVar4->m[0xc].n;
      uStack_8b = pgVar4->m[0xd].n;
      uStack_8a = pgVar4->m[0xe].n;
      bStack_89 = pgVar4->m[0xf].n;
      uVar23 = (uchar)uVar2;
      auVar28[0] = -(local_98 == uVar23);
      uVar24 = (uchar)((uint)uVar2 >> 8);
      auVar28[1] = -(uStack_97 == uVar24);
      uVar25 = (uchar)((uint)uVar2 >> 0x10);
      auVar28[2] = -(uStack_96 == uVar25);
      bVar26 = (byte)((uint)uVar2 >> 0x18);
      auVar28[3] = -(bStack_95 == bVar26);
      auVar28[4] = -(uStack_94 == uVar23);
      auVar28[5] = -(uStack_93 == uVar24);
      auVar28[6] = -(uStack_92 == uVar25);
      auVar28[7] = -(bStack_91 == bVar26);
      auVar28[8] = -(uStack_90 == uVar23);
      auVar28[9] = -(uStack_8f == uVar24);
      auVar28[10] = -(uStack_8e == uVar25);
      auVar28[0xb] = -(bStack_8d == bVar26);
      auVar28[0xc] = -(uStack_8c == uVar23);
      auVar28[0xd] = -(uStack_8b == uVar24);
      auVar28[0xe] = -(uStack_8a == uVar25);
      auVar28[0xf] = -(bStack_89 == bVar26);
      for (uVar17 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe); local_a8 = pSVar3
          , uVar17 != 0; uVar17 = uVar17 - 1 & uVar17) {
        uVar8 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        if (pSVar3 == (StatementBlockSymbol *)
                      (this->disableBranches).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
                      .arrays.elements_[uVar22 * 0xf + (ulong)uVar8].first) goto LAB_001cb192;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_89) == 0) break;
      lVar21 = uVar22 + uVar14;
      uVar14 = uVar14 + 1;
      uVar22 = lVar21 + 1U & uVar19;
    } while (uVar14 <= uVar19);
    if ((this->disableBranches).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
        .size_ctrl.size <
        (this->disableBranches).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
                  *)this_01,pos0,hash,&local_b1,(Symbol **)&local_a8,
                 (SmallVector<int,_10UL> *)&stmtPtr);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
                  *)this_01,hash,&local_b1,(Symbol **)&local_a8,(SmallVector<int,_10UL> *)&stmtPtr);
    }
LAB_001cb192:
    SmallVectorBase<int>::cleanup((SmallVectorBase<int> *)&stmtPtr,this_01);
  }
  pBVar20 = local_b0;
  if (local_b0->blockKind == Sequential) {
    ast::Statement::visit<TestAnalysis&>(local_b0->body,(TestAnalysis *)this);
  }
  else {
    stmtPtr = local_b0->body;
    if (stmtPtr->kind == List) {
      ppSVar15 = *(Statement ***)(stmtPtr + 1);
      pSVar16 = stmtPtr[1].syntax;
    }
    else {
      ppSVar15 = &stmtPtr;
      pSVar16 = (StatementSyntax *)0x1;
    }
    lVar21 = (long)pSVar16 * 8;
    uVar19 = 0;
    while ((uVar22 = (ulong)pSVar16 & 0x1fffffffffffffff, lVar21 != 0 &&
           (uVar22 = uVar19, ppSVar15[uVar19]->kind == VariableDeclaration))) {
      ast::Statement::visit<TestAnalysis&>(ppSVar15[uVar19],(TestAnalysis *)this);
      uVar19 = uVar19 + 1;
      lVar21 = lVar21 + -8;
    }
    local_a0 = (long)pSVar16 - uVar22;
    iVar13 = this->state;
    iVar18 = iVar13;
    for (lVar21 = uVar22 << 3; (long)pSVar16 * 8 != lVar21; lVar21 = lVar21 + 8) {
      this_00 = *(Statement **)((long)ppSVar15 + lVar21);
      this->isStateSplit = false;
      this->state = iVar13;
      this->stateWhenTrue = 0;
      this->stateWhenFalse = 0;
      ast::Statement::visit<TestAnalysis&>(this_00,(TestAnalysis *)this);
      if (local_b0->blockKind == JoinAll) {
        iVar11 = this->state;
LAB_001cb283:
        if (iVar11 < iVar18) {
          iVar18 = iVar11;
        }
      }
      else if (local_b0->blockKind != JoinNone) {
        iVar11 = this->state;
        if (local_a0 == 1) goto LAB_001cb283;
        iVar18 = iVar18 + iVar11;
      }
    }
    this->isStateSplit = false;
    this->state = iVar18;
    this->stateWhenTrue = 0;
    this->stateWhenFalse = 0;
    pBVar20 = local_b0;
  }
  pSVar3 = pBVar20->blockSymbol;
  if (pSVar3 == (StatementBlockSymbol *)0x0) {
    return;
  }
  auVar10._8_8_ = 0;
  auVar10._0_8_ = pSVar3;
  uVar22 = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar19 = uVar22 >> ((byte)(this->disableBranches).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar4 = (this->disableBranches).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
           .arrays.groups_;
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar22 & 0xff];
  ppVar5 = (this->disableBranches).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
           .arrays.elements_;
  lVar21 = 0;
  do {
    pgVar1 = pgVar4 + uVar19;
    uVar23 = (uchar)uVar2;
    auVar29[0] = -(pgVar1->m[0].n == uVar23);
    uVar24 = (uchar)((uint)uVar2 >> 8);
    auVar29[1] = -(pgVar1->m[1].n == uVar24);
    uVar25 = (uchar)((uint)uVar2 >> 0x10);
    auVar29[2] = -(pgVar1->m[2].n == uVar25);
    uVar27 = (uchar)((uint)uVar2 >> 0x18);
    auVar29[3] = -(pgVar1->m[3].n == uVar27);
    auVar29[4] = -(pgVar1->m[4].n == uVar23);
    auVar29[5] = -(pgVar1->m[5].n == uVar24);
    auVar29[6] = -(pgVar1->m[6].n == uVar25);
    auVar29[7] = -(pgVar1->m[7].n == uVar27);
    auVar29[8] = -(pgVar1->m[8].n == uVar23);
    auVar29[9] = -(pgVar1->m[9].n == uVar24);
    auVar29[10] = -(pgVar1->m[10].n == uVar25);
    auVar29[0xb] = -(pgVar1->m[0xb].n == uVar27);
    auVar29[0xc] = -(pgVar1->m[0xc].n == uVar23);
    auVar29[0xd] = -(pgVar1->m[0xd].n == uVar24);
    auVar29[0xe] = -(pgVar1->m[0xe].n == uVar25);
    auVar29[0xf] = -(pgVar1->m[0xf].n == uVar27);
    for (uVar17 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe); uVar17 != 0;
        uVar17 = uVar17 - 1 & uVar17) {
      uVar8 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      uVar22 = (ulong)uVar8;
      if (pSVar3 == (StatementBlockSymbol *)ppVar5[uVar19 * 0xf + uVar22].first) {
        piVar6 = ppVar5[uVar19 * 0xf + uVar22].second.super_SmallVectorBase<int>.data_;
        sVar7 = ppVar5[uVar19 * 0xf + uVar22].second.super_SmallVectorBase<int>.len;
        iVar13 = this->state;
        for (lVar21 = 0; sVar7 << 2 != lVar21; lVar21 = lVar21 + 4) {
          iVar13 = iVar13 + *(int *)((long)piVar6 + lVar21);
          this->state = iVar13;
        }
        pos.p_ = (table_element_pointer)(pgVar4[uVar19].m + uVar22);
        pos.pc_ = (char_pointer)&this->disableBranches;
        boost::unordered::detail::foa::
        table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
        ::erase<false,_nullptr>
                  ((table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                    *)&stmtPtr,pos);
        return;
      }
    }
    lVar12 = uVar19 + lVar21;
    lVar21 = lVar21 + 1;
    uVar19 = lVar12 + 1U &
             (this->disableBranches).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
             .arrays.groups_size_mask;
  } while( true );
}

Assistant:

void visitStmt(const BlockStatement& stmt) {
        // This block could be the target of a disable statement.
        if (stmt.blockSymbol) {
            auto [it, inserted] = disableBranches.try_emplace(stmt.blockSymbol,
                                                              SmallVector<TState>{});
            SLANG_ASSERT(inserted);
        }

        if (stmt.blockKind == StatementBlockKind::Sequential) {
            visit(stmt.body);
        }
        else {
            auto stmtPtr = &stmt.body;
            auto statements = stmt.body.kind == StatementKind::List
                                  ? stmt.body.as<StatementList>().list
                                  : std::span(&stmtPtr, 1);
            size_t numLocalDecls = 0;
            for (auto s : statements) {
                // Variable declaration initializers happen before
                // we fork the remaining statements.
                if (s->kind == StatementKind::VariableDeclaration) {
                    visit(*s);
                    numLocalDecls++;
                }
                else {
                    break;
                }
            }
            statements = statements.subspan(numLocalDecls);

            // Each remaining statement is executed in parallel.
            auto currState = (DERIVED).copyState(state);
            auto finalState = std::move(state);
            for (auto s : statements) {
                setState((DERIVED).copyState(currState));
                visit(*s);

                switch (stmt.blockKind) {
                    case StatementBlockKind::JoinAny:
                        // If there's only one statement (a pathological case)
                        // then we can meet it; otherwise we must join since
                        // there is uncertainty about which path was taken.
                        if (statements.size() == 1)
                            (DERIVED).meetState(finalState, state);
                        else
                            (DERIVED).joinState(finalState, state);
                        break;
                    case StatementBlockKind::JoinAll:
                        // All paths must be taken, so we meet the states.
                        (DERIVED).meetState(finalState, state);
                        break;
                    case StatementBlockKind::JoinNone:
                        // No paths will be taken by the time the fork
                        // moves on so we discard this state.
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
            setState(std::move(finalState));
        }

        // Once we're done with a block we remove it as a disable target.
        // A disable statement can target any block in the hierarchy but
        // we don't analyze the control flow implications for targets that
        // aren't part of the current execution stack.
        if (stmt.blockSymbol) {
            auto it = disableBranches.find(stmt.blockSymbol);
            SLANG_ASSERT(it != disableBranches.end());

            for (auto& branchState : it->second)
                (DERIVED).joinState(state, branchState);

            disableBranches.erase(it);
        }
    }